

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast-lstm.cc
# Opt level: O0

Expression __thiscall
dynet::FastLSTMBuilder::add_input_impl(FastLSTMBuilder *this,int prev,Expression *x)

{
  Expression *y;
  reference pvVar1;
  reference pvVar2;
  const_reference pvVar3;
  Expression *y_00;
  Expression *x_00;
  undefined8 *in_RDX;
  Expression *x_01;
  int in_ESI;
  long in_RDI;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 uVar4;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 uVar5;
  undefined4 extraout_XMM0_Db_01;
  Expression EVar6;
  Expression ph_t;
  Expression i_ot;
  Expression i_aot;
  Expression i_crt;
  Expression i_nwt;
  Expression i_wt;
  Expression i_awt;
  Expression i_ft;
  Expression i_it;
  Expression i_ait;
  bool has_prev_state;
  Expression i_c_tm1;
  Expression i_h_tm1;
  vector<dynet::Expression,_std::allocator<dynet::Expression>_> *vars;
  uint i;
  Expression in;
  vector<dynet::Expression,_std::allocator<dynet::Expression>_> *ct;
  vector<dynet::Expression,_std::allocator<dynet::Expression>_> *ht;
  value_type *in_stack_fffffffffffffb88;
  const_reference in_stack_fffffffffffffb90;
  byte local_461;
  allocator_type *in_stack_fffffffffffffba0;
  size_type in_stack_fffffffffffffba8;
  vector<dynet::Expression,_std::allocator<dynet::Expression>_> *in_stack_fffffffffffffbb0;
  vector<dynet::Expression,_std::allocator<dynet::Expression>_> *this_00;
  ComputationGraph *local_428;
  undefined8 local_420;
  Expression *in_stack_fffffffffffffbe8;
  Expression *in_stack_fffffffffffffbf0;
  ComputationGraph *local_3f8;
  undefined8 local_3f0;
  ComputationGraph *local_3e8;
  undefined8 local_3e0;
  ComputationGraph *local_3d8;
  undefined8 local_3d0;
  undefined8 *local_3c8;
  undefined8 local_3c0;
  Expression local_3b8;
  Expression local_3a8;
  ComputationGraph *local_398;
  undefined8 local_390;
  ComputationGraph *local_388;
  undefined8 local_380;
  ComputationGraph *local_378;
  undefined8 local_370;
  ComputationGraph *local_368;
  undefined8 local_360;
  ComputationGraph *local_358;
  VariableIndex local_350;
  uint uStack_34c;
  undefined8 *local_348;
  undefined8 local_340;
  Expression local_338;
  Expression local_328;
  Expression local_318;
  Expression local_308;
  Expression local_2f8;
  Expression local_2e8;
  Expression local_2d8;
  ComputationGraph *local_2b8;
  undefined8 local_2b0;
  ComputationGraph *local_2a8;
  undefined8 local_2a0;
  ComputationGraph *local_298;
  undefined8 local_290;
  undefined8 *local_288;
  undefined8 local_280;
  Expression local_278;
  ComputationGraph *local_268;
  undefined8 local_260;
  ComputationGraph *local_258;
  undefined8 local_250;
  ComputationGraph *local_248;
  undefined8 local_240;
  ComputationGraph *local_238;
  undefined8 local_230;
  ComputationGraph *local_228;
  VariableIndex local_220;
  uint uStack_21c;
  undefined8 *local_218;
  undefined8 local_210;
  Expression local_208;
  Expression local_1f8;
  Expression local_1e8;
  Expression local_1d8;
  ComputationGraph *local_1c8;
  undefined8 local_1c0;
  ComputationGraph *local_1b8;
  undefined8 local_1b0;
  ComputationGraph *local_1a8;
  undefined8 local_1a0;
  undefined8 *local_198;
  undefined8 local_190;
  Expression local_188;
  Expression local_178;
  ComputationGraph *local_168;
  undefined8 local_160;
  ComputationGraph *local_158;
  undefined8 local_150;
  ComputationGraph *local_148;
  undefined8 local_140;
  ComputationGraph *local_138;
  undefined8 local_130;
  ComputationGraph *local_128;
  VariableIndex local_120;
  uint uStack_11c;
  undefined8 *local_118;
  undefined8 local_110;
  Expression local_108;
  Expression local_f8;
  Expression local_e8;
  byte local_d1;
  Expression local_d0;
  Expression local_c0;
  reference local_b0;
  uint local_a4;
  ComputationGraph *local_a0;
  undefined8 local_98;
  reference local_90;
  reference local_88;
  vector<dynet::Expression,_std::allocator<dynet::Expression>_> local_79 [3];
  undefined8 *local_30;
  int local_24;
  
  local_30 = in_RDX;
  local_24 = in_ESI;
  std::allocator<dynet::Expression>::allocator((allocator<dynet::Expression> *)0x967bd7);
  std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::vector
            (in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,in_stack_fffffffffffffba0);
  std::
  vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
  ::push_back((vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
               *)in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
  std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::~vector
            ((vector<dynet::Expression,_std::allocator<dynet::Expression>_> *)
             in_stack_fffffffffffffba0);
  std::allocator<dynet::Expression>::~allocator((allocator<dynet::Expression> *)0x967c1e);
  x_00 = (Expression *)(in_RDI + 0x118);
  y = (Expression *)(ulong)*(uint *)(in_RDI + 0x168);
  this_00 = local_79;
  std::allocator<dynet::Expression>::allocator((allocator<dynet::Expression> *)0x967c4f);
  std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::vector
            (this_00,(size_type)y,(allocator_type *)x_00);
  std::
  vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
  ::push_back((vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
               *)in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
  std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::~vector
            ((vector<dynet::Expression,_std::allocator<dynet::Expression>_> *)x_00);
  std::allocator<dynet::Expression>::~allocator((allocator<dynet::Expression> *)0x967c96);
  local_88 = std::
             vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
             ::back((vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
                     *)in_stack_fffffffffffffb90);
  local_90 = std::
             vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
             ::back((vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
                     *)in_stack_fffffffffffffb90);
  local_a0 = (ComputationGraph *)*local_30;
  local_98 = local_30[1];
  for (local_a4 = 0; local_a4 < *(uint *)(in_RDI + 0x168); local_a4 = local_a4 + 1) {
    local_b0 = std::
               vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
               ::operator[]((vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
                             *)(in_RDI + 0xe8),(ulong)local_a4);
    Expression::Expression(&local_c0);
    Expression::Expression(&local_d0);
    local_461 = 1;
    if (local_24 < 0) {
      local_461 = *(byte *)(in_RDI + 0x130);
    }
    local_d1 = local_461 & 1;
    if (local_24 < 0) {
      if ((*(byte *)(in_RDI + 0x130) & 1) != 0) {
        pvVar1 = std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::operator[]
                           ((vector<dynet::Expression,_std::allocator<dynet::Expression>_> *)
                            (in_RDI + 0x138),(ulong)local_a4);
        local_c0.pg = pvVar1->pg;
        local_c0.i = pvVar1->i;
        local_c0.graph_id = pvVar1->graph_id;
        pvVar1 = std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::operator[]
                           ((vector<dynet::Expression,_std::allocator<dynet::Expression>_> *)
                            (in_RDI + 0x150),(ulong)local_a4);
        local_d0.pg = pvVar1->pg;
        local_d0.i = pvVar1->i;
        local_d0.graph_id = pvVar1->graph_id;
      }
    }
    else {
      pvVar2 = std::
               vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
               ::operator[]((vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
                             *)(in_RDI + 0x100),(long)local_24);
      pvVar1 = std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::operator[]
                         (pvVar2,(ulong)local_a4);
      local_c0.pg = pvVar1->pg;
      local_c0.i = pvVar1->i;
      local_c0.graph_id = pvVar1->graph_id;
      pvVar2 = std::
               vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
               ::operator[]((vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
                             *)(in_RDI + 0x118),(long)local_24);
      pvVar1 = std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::operator[]
                         (pvVar2,(ulong)local_a4);
      local_d0.pg = pvVar1->pg;
      local_d0.i = pvVar1->i;
      local_d0.graph_id = pvVar1->graph_id;
    }
    Expression::Expression(&local_e8);
    if ((local_d1 & 1) == 0) {
      pvVar3 = std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::operator[]
                         (local_b0,3);
      local_1c8 = pvVar3->pg;
      local_1c0._0_4_ = pvVar3->i;
      local_1c0._4_4_ = pvVar3->graph_id;
      pvVar3 = std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::operator[]
                         (local_b0,0);
      local_1b8 = pvVar3->pg;
      local_1b0._0_4_ = pvVar3->i;
      local_1b0._4_4_ = pvVar3->graph_id;
      local_1a8 = local_a0;
      local_1a0 = local_98;
      local_198 = &local_1c8;
      local_190 = 3;
      EVar6 = affine_transform((initializer_list<dynet::Expression> *)0x968136);
      local_188.pg = EVar6.pg;
      local_e8.pg = local_188.pg;
      local_188._8_8_ = EVar6._8_8_;
      local_e8.i = local_188.i;
      local_e8.graph_id = local_188.graph_id;
      local_188 = EVar6;
    }
    else {
      pvVar3 = std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::operator[]
                         (local_b0,3);
      local_168 = pvVar3->pg;
      local_160._0_4_ = pvVar3->i;
      local_160._4_4_ = pvVar3->graph_id;
      pvVar3 = std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::operator[]
                         (local_b0,0);
      local_158 = pvVar3->pg;
      local_150._0_4_ = pvVar3->i;
      local_150._4_4_ = pvVar3->graph_id;
      local_148 = local_a0;
      local_140 = local_98;
      pvVar3 = std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::operator[]
                         (local_b0,1);
      local_138 = pvVar3->pg;
      local_130._0_4_ = pvVar3->i;
      local_130._4_4_ = pvVar3->graph_id;
      local_128 = local_c0.pg;
      local_120 = local_c0.i;
      uStack_11c = local_c0.graph_id;
      local_118 = &local_168;
      local_110 = 5;
      local_108 = affine_transform((initializer_list<dynet::Expression> *)0x968010);
      std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::operator[](local_b0,2);
      local_178 = cmult(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
      EVar6 = dynet::operator+(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
      local_f8.pg = EVar6.pg;
      local_e8.pg = local_f8.pg;
      local_f8._8_8_ = EVar6._8_8_;
      local_e8.i = local_f8.i;
      local_e8.graph_id = local_f8.graph_id;
      local_f8 = EVar6;
    }
    local_1d8 = logistic(x_00);
    local_1e8 = dynet::operator-((real)((ulong)this_00 >> 0x20),y);
    Expression::Expression(&local_1f8);
    if ((local_d1 & 1) == 0) {
      pvVar3 = std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::operator[]
                         (local_b0,10);
      local_2b8 = pvVar3->pg;
      local_2b0._0_4_ = pvVar3->i;
      local_2b0._4_4_ = pvVar3->graph_id;
      pvVar3 = std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::operator[]
                         (local_b0,8);
      local_2a8 = pvVar3->pg;
      local_2a0._0_4_ = pvVar3->i;
      local_2a0._4_4_ = pvVar3->graph_id;
      local_298 = local_a0;
      local_290 = local_98;
      local_288 = &local_2b8;
      local_280 = 3;
      EVar6 = affine_transform((initializer_list<dynet::Expression> *)0x968377);
      local_278.pg = EVar6.pg;
      local_1f8.pg = local_278.pg;
      local_278._8_8_ = EVar6._8_8_;
      local_1f8.i = local_278.i;
      local_1f8.graph_id = local_278.graph_id;
      uVar4 = extraout_XMM0_Da_00;
      uVar5 = extraout_XMM0_Db_00;
      local_278 = EVar6;
    }
    else {
      pvVar3 = std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::operator[]
                         (local_b0,10);
      local_268 = pvVar3->pg;
      local_260._0_4_ = pvVar3->i;
      local_260._4_4_ = pvVar3->graph_id;
      pvVar3 = std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::operator[]
                         (local_b0,8);
      local_258 = pvVar3->pg;
      local_250._0_4_ = pvVar3->i;
      local_250._4_4_ = pvVar3->graph_id;
      local_248 = local_a0;
      local_240 = local_98;
      pvVar3 = std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::operator[]
                         (local_b0,9);
      local_238 = pvVar3->pg;
      local_230._0_4_ = pvVar3->i;
      local_230._4_4_ = pvVar3->graph_id;
      local_228 = local_c0.pg;
      local_220 = local_c0.i;
      uStack_21c = local_c0.graph_id;
      local_218 = &local_268;
      local_210 = 5;
      EVar6 = affine_transform((initializer_list<dynet::Expression> *)0x9682a7);
      local_208.pg = EVar6.pg;
      local_1f8.pg = local_208.pg;
      local_208._8_8_ = EVar6._8_8_;
      local_1f8.i = local_208.i;
      local_1f8.graph_id = local_208.graph_id;
      uVar4 = extraout_XMM0_Da;
      uVar5 = extraout_XMM0_Db;
      local_208 = EVar6;
    }
    tanh((double)CONCAT44(uVar5,uVar4));
    if ((local_d1 & 1) == 0) {
      local_308 = cmult(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
      pvVar1 = std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::operator[]
                         (local_90,(ulong)local_a4);
      EVar6 = local_308;
      pvVar1->pg = local_308.pg;
      pvVar1->i = local_308.i;
      pvVar1->graph_id = local_308.graph_id;
      local_308 = EVar6;
    }
    else {
      local_2d8 = cmult(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
      local_2e8 = cmult(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
      local_2f8 = dynet::operator+(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
      pvVar1 = std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::operator[]
                         (local_90,(ulong)local_a4);
      EVar6 = local_2f8;
      pvVar1->pg = local_2f8.pg;
      pvVar1->i = local_2f8.i;
      pvVar1->graph_id = local_2f8.graph_id;
      local_2f8 = EVar6;
    }
    Expression::Expression(&local_318);
    if ((local_d1 & 1) == 0) {
      pvVar3 = std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::operator[]
                         (local_b0,7);
      local_3f8 = pvVar3->pg;
      local_3f0._0_4_ = pvVar3->i;
      local_3f0._4_4_ = pvVar3->graph_id;
      pvVar3 = std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::operator[]
                         (local_b0,4);
      local_3e8 = pvVar3->pg;
      local_3e0._0_4_ = pvVar3->i;
      local_3e0._4_4_ = pvVar3->graph_id;
      local_3d8 = local_a0;
      local_3d0 = local_98;
      local_3c8 = &local_3f8;
      local_3c0 = 3;
      EVar6 = affine_transform((initializer_list<dynet::Expression> *)0x968700);
      local_3b8.pg = EVar6.pg;
      local_318.pg = local_3b8.pg;
      local_3b8._8_8_ = EVar6._8_8_;
      local_318.i = local_3b8.i;
      local_318.graph_id = local_3b8.graph_id;
      local_3b8 = EVar6;
    }
    else {
      pvVar3 = std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::operator[]
                         (local_b0,7);
      local_398 = pvVar3->pg;
      local_390._0_4_ = pvVar3->i;
      local_390._4_4_ = pvVar3->graph_id;
      pvVar3 = std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::operator[]
                         (local_b0,4);
      local_388 = pvVar3->pg;
      local_380._0_4_ = pvVar3->i;
      local_380._4_4_ = pvVar3->graph_id;
      local_378 = local_a0;
      local_370 = local_98;
      pvVar3 = std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::operator[]
                         (local_b0,5);
      local_368 = pvVar3->pg;
      local_360._0_4_ = pvVar3->i;
      local_360._4_4_ = pvVar3->graph_id;
      local_358 = local_c0.pg;
      local_350 = local_c0.i;
      uStack_34c = local_c0.graph_id;
      local_348 = &local_398;
      local_340 = 5;
      local_338 = affine_transform((initializer_list<dynet::Expression> *)0x9685c1);
      in_stack_fffffffffffffb90 =
           std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::operator[]
                     (local_b0,6);
      std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::operator[]
                (local_90,(ulong)local_a4);
      local_3a8 = cmult(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
      EVar6 = dynet::operator+(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
      local_328.pg = EVar6.pg;
      local_318.pg = local_328.pg;
      local_328._8_8_ = EVar6._8_8_;
      local_318.i = local_328.i;
      local_318.graph_id = local_328.graph_id;
      local_328 = EVar6;
    }
    logistic(x_00);
    std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::operator[]
              (local_90,(ulong)local_a4);
    tanh((double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01));
    in_stack_fffffffffffffbe8 = y_00;
    in_stack_fffffffffffffbf0 = x_01;
    EVar6 = cmult(x_01,y_00);
    pvVar1 = std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::operator[]
                       (local_88,(ulong)local_a4);
    local_428 = EVar6.pg;
    pvVar1->pg = local_428;
    local_420 = EVar6._8_8_;
    pvVar1->i = (undefined4)local_420;
    pvVar1->graph_id = local_420._4_4_;
    local_a0 = pvVar1->pg;
    local_98._0_4_ = pvVar1->i;
    local_98._4_4_ = pvVar1->graph_id;
  }
  pvVar1 = std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::back
                     ((vector<dynet::Expression,_std::allocator<dynet::Expression>_> *)
                      in_stack_fffffffffffffb90);
  EVar6.pg = pvVar1->pg;
  EVar6.i = pvVar1->i;
  EVar6.graph_id = pvVar1->graph_id;
  return EVar6;
}

Assistant:

Expression FastLSTMBuilder::add_input_impl(int prev, const Expression& x) {
  h.push_back(vector<Expression>(layers));
  c.push_back(vector<Expression>(layers));
  vector<Expression>& ht = h.back();
  vector<Expression>& ct = c.back();
  Expression in = x;
  for (unsigned i = 0; i < layers; ++i) {
    const vector<Expression>& vars = param_vars[i];
    Expression i_h_tm1, i_c_tm1;
    bool has_prev_state = (prev >= 0 || has_initial_state);
    if (prev < 0) {
      if (has_initial_state) {
        // intial value for h and c at timestep 0 in layer i
        // defaults to zero matrix input if not set in add_parameter_edges
        i_h_tm1 = h0[i];
        i_c_tm1 = c0[i];
      }
    } else {  // t > 0
      i_h_tm1 = h[prev][i];
      i_c_tm1 = c[prev][i];
    }
    // input
    Expression i_ait;
    if (has_prev_state) {
//      i_ait = vars[BI] + vars[X2I] * in + vars[H2I]*i_h_tm1 + cmult(vars[C2I], i_c_tm1);
      i_ait = affine_transform({vars[BI], vars[X2I], in, vars[H2I], i_h_tm1}) +
              cmult(vars[C2I], i_c_tm1);
    } else {
//      i_ait = vars[BI] + vars[X2I] * in;
      i_ait = affine_transform({vars[BI], vars[X2I], in});
    }
    Expression i_it = logistic(i_ait);
    // forget
    Expression i_ft = 1.f - i_it;
    // write memory cell
    Expression i_awt;
    if (has_prev_state)
//      i_awt = vars[BC] + vars[X2C] * in + vars[H2C]*i_h_tm1;
      i_awt = affine_transform({vars[BC], vars[X2C], in, vars[H2C], i_h_tm1});
    else
//      i_awt = vars[BC] + vars[X2C] * in;
      i_awt = affine_transform({vars[BC], vars[X2C], in});
    Expression i_wt = tanh(i_awt);
    // output
    if (has_prev_state) {
      Expression i_nwt = cmult(i_it,i_wt);
      Expression i_crt = cmult(i_ft,i_c_tm1);
      ct[i] = i_crt + i_nwt;
    } else {
      ct[i] = cmult(i_it,i_wt);
    }

    Expression i_aot;
    if (has_prev_state) {
//      i_aot = vars[BO] + vars[X2O] * in + vars[H2O] * i_h_tm1 + cmult(vars[C2O], ct[i]);
      i_aot = affine_transform({vars[BO], vars[X2O], in, vars[H2O], i_h_tm1}) +
              cmult(vars[C2O], ct[i]);
    }
    else {
//      i_aot = vars[BO] + vars[X2O] * in;
      i_aot = affine_transform({vars[BO], vars[X2O], in});
    }
    Expression i_ot = logistic(i_aot);
    Expression ph_t = tanh(ct[i]);
    in = ht[i] = cmult(i_ot,ph_t);
  }
  return ht.back();
}